

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QWidget * __thiscall QMainWindowLayout::getSeparatorWidget(QMainWindowLayout *this)

{
  iterator iVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  QWidget *parent;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QWidget *copy;
  QHashDummyValue local_21;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x758) == 0) {
    this_00.m_data = operator_new(0x28);
    parent = QLayout::parentWidget((QLayout *)this);
    QWidget::QWidget((QWidget *)this_00.m_data,parent,(WindowFlags)0x0);
    QWidget::setAttribute((QWidget *)this_00.m_data,WA_MouseNoMask,true);
    QWidget::setAutoFillBackground((QWidget *)this_00.m_data,false);
    QVar2.m_size = (size_t)"qt_qmainwindow_extended_splitter";
    QVar2.field_0.m_data = this_00.m_data;
    QObject::setObjectName(QVar2);
  }
  else {
    iVar1 = QList<QWidget_*>::end((QList<QWidget_*> *)(this + 0x748));
    this_00 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
              ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(iVar1.i + -1))->m_data;
    *(long *)(this + 0x758) = *(long *)(this + 0x758) + -1;
  }
  local_20 = this_00;
  QHash<QWidget*,QHashDummyValue>::emplace<QHashDummyValue_const&>
            ((QHash<QWidget*,QHashDummyValue> *)(this + 0x740),(QWidget **)&local_20.m_data,
             &local_21);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QWidget *)this_00.m_data;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QMainWindowLayout::getSeparatorWidget()
{
    QWidget *result = nullptr;
    if (!unusedSeparatorWidgets.isEmpty()) {
        result = unusedSeparatorWidgets.takeLast();
    } else {
        result = new QWidget(parentWidget());
        result->setAttribute(Qt::WA_MouseNoMask, true);
        result->setAutoFillBackground(false);
        result->setObjectName("qt_qmainwindow_extended_splitter"_L1);
    }
    usedSeparatorWidgets.insert(result);
    return result;
}